

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

int uv__stream_recv_cmsg(uv_stream_t *stream,msghdr *msg)

{
  int fd_00;
  int iVar1;
  ulong uVar2;
  cmsghdr *local_48;
  size_t count;
  size_t i;
  int err;
  int fd;
  cmsghdr *cmsg;
  msghdr *msg_local;
  uv_stream_t *stream_local;
  
  if (msg->msg_controllen < 0x10) {
    local_48 = (cmsghdr *)0x0;
  }
  else {
    local_48 = (cmsghdr *)msg->msg_control;
  }
  _err = local_48;
  do {
    if (_err == (cmsghdr *)0x0) {
      return 0;
    }
    if (_err->cmsg_type == 1) {
      if (_err->cmsg_len < 0x10) {
        __assert_fail("cmsg->cmsg_len >= CMSG_LEN(0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/stream.c"
                      ,0x3e2,"int uv__stream_recv_cmsg(uv_stream_t *, struct msghdr *)");
      }
      uVar2 = _err->cmsg_len - 0x10;
      if ((uVar2 & 3) != 0) {
        __assert_fail("count % sizeof(fd) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/stream.c"
                      ,0x3e4,"int uv__stream_recv_cmsg(uv_stream_t *, struct msghdr *)");
      }
      uVar2 = uVar2 >> 2;
      for (count = 0; count < uVar2; count = count + 1) {
        fd_00 = *(int *)((long)&_err[1].cmsg_len + count * 4);
        if (stream->accepted_fd == -1) {
          stream->accepted_fd = fd_00;
        }
        else {
          iVar1 = uv__stream_queue_fd(stream,fd_00);
          if (iVar1 != 0) {
            for (; count < uVar2; count = count + 1) {
              uv__close(fd_00);
            }
            return iVar1;
          }
        }
      }
    }
    else {
      fprintf(_stderr,"ignoring non-SCM_RIGHTS ancillary data: %d\n",(ulong)(uint)_err->cmsg_type);
    }
    _err = __cmsg_nxthdr((msghdr *)msg,_err);
  } while( true );
}

Assistant:

static int uv__stream_recv_cmsg(uv_stream_t* stream, struct msghdr* msg) {
  struct cmsghdr* cmsg;
  int fd;
  int err;
  size_t i;
  size_t count;

  for (cmsg = CMSG_FIRSTHDR(msg); cmsg != NULL; cmsg = CMSG_NXTHDR(msg, cmsg)) {
    if (cmsg->cmsg_type != SCM_RIGHTS) {
      fprintf(stderr, "ignoring non-SCM_RIGHTS ancillary data: %d\n",
          cmsg->cmsg_type);
      continue;
    }

    assert(cmsg->cmsg_len >= CMSG_LEN(0));
    count = cmsg->cmsg_len - CMSG_LEN(0);
    assert(count % sizeof(fd) == 0);
    count /= sizeof(fd);

    for (i = 0; i < count; i++) {
      memcpy(&fd, (char*) CMSG_DATA(cmsg) + i * sizeof(fd), sizeof(fd));
      /* Already has accepted fd, queue now */
      if (stream->accepted_fd != -1) {
        err = uv__stream_queue_fd(stream, fd);
        if (err != 0) {
          /* Close rest */
          for (; i < count; i++)
            uv__close(fd);
          return err;
        }
      } else {
        stream->accepted_fd = fd;
      }
    }
  }

  return 0;
}